

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall
rest_rpc::rpc_client::callback_sub(rpc_client *this,error_code *ec,string_view result)

{
  bool bVar1;
  pointer ppVar2;
  exception *anon_var_0;
  iterator it;
  __tuple_element_t<2UL,_tuple<int,_basic_string<char>,_basic_string<char>_>_> *data;
  __tuple_element_t<1UL,_tuple<int,_basic_string<char>,_basic_string<char>_>_> *key;
  __tuple_element_t<0UL,_tuple<int,_basic_string<char>,_basic_string<char>_>_> code;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tp;
  msgpack_codec codec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)> *this_00;
  basic_string_view<char,_std::char_traits<char>_> in_stack_fffffffffffffed8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  in_stack_ffffffffffffff48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  in_stack_ffffffffffffff50;
  msgpack_codec *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x266ba6);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  rpc_service::msgpack_codec::unpack<std::tuple<int,std::__cxx11::string,std::__cxx11::string>>
            (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50._M_cur,
             (size_t)in_stack_ffffffffffffff48._M_cur);
  std::get<0ul,int,std::__cxx11::string,std::__cxx11::string>
            ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x266bf5);
  std::get<1ul,int,std::__cxx11::string,std::__cxx11::string>
            ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x266c08);
  std::get<2ul,int,std::__cxx11::string,std::__cxx11::string>
            ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x266c1a);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
          *)in_stack_fffffffffffffec8,(key_type *)0x266c3b);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
         *)in_stack_fffffffffffffec8);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                      *)&stack0xffffffffffffff50,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                      *)&stack0xffffffffffffff48);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>
                           *)0x266d5b);
    this_00 = &ppVar2->second;
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_fffffffffffffec8
              );
    std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>::
    operator()(this_00,in_stack_fffffffffffffed8);
  }
  std::
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x266da1);
  rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x266d46);
  return;
}

Assistant:

void callback_sub(const asio::error_code &ec, string_view result) {
    rpc_service::msgpack_codec codec;
    try {
      auto tp = codec.unpack<std::tuple<int, std::string, std::string>>(
          result.data(), result.size());
      auto code = std::get<0>(tp);
      auto &key = std::get<1>(tp);
      auto &data = std::get<2>(tp);

      auto it = sub_map_.find(key);
      if (it == sub_map_.end()) {
        return;
      }

      it->second(data);
    } catch (const std::exception & /*ex*/) {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument));
    }
  }